

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

UpperTriangularLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_uppertriangular(NeuralNetworkLayer *this)

{
  UpperTriangularLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x52d) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x52d;
    this_00 = (UpperTriangularLayerParams *)operator_new(0x20);
    UpperTriangularLayerParams::UpperTriangularLayerParams(this_00);
    (this->layer_).uppertriangular_ = this_00;
  }
  return (UpperTriangularLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::UpperTriangularLayerParams* NeuralNetworkLayer::mutable_uppertriangular() {
  if (!has_uppertriangular()) {
    clear_layer();
    set_has_uppertriangular();
    layer_.uppertriangular_ = new ::CoreML::Specification::UpperTriangularLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.upperTriangular)
  return layer_.uppertriangular_;
}